

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

void Abc_NtkPrintPoEquivs(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  Vec_Int_t *vMap;
  int iRepr;
  int i;
  Abc_Obj_t *pRepr;
  Abc_Obj_t *pDriver;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkObjNumMax(pNtk);
  p = Vec_IntStartFull(iVar1);
  for (vMap._4_4_ = 0; iVar1 = Abc_NtkPoNum(pNtk), vMap._4_4_ < iVar1; vMap._4_4_ = vMap._4_4_ + 1)
  {
    pObj_00 = Abc_NtkPo(pNtk,vMap._4_4_);
    pAVar4 = Abc_ObjFanin0(pObj_00);
    iVar1 = Abc_NtkIsStrash(pNtk);
    if ((iVar1 == 0) || (pAVar5 = Abc_AigConst1(pNtk), pAVar4 != pAVar5)) {
      iVar1 = Abc_NtkIsStrash(pNtk);
      if ((iVar1 == 0) && (iVar1 = Abc_NodeIsConst(pAVar4), iVar1 != 0)) {
        pcVar6 = Abc_ObjName(pObj_00);
        uVar2 = Abc_NodeIsConst1(pAVar4);
        printf("%s = Const%d\n",pcVar6,(ulong)uVar2);
      }
      else {
        uVar2 = Abc_ObjId(pAVar4);
        iVar1 = Vec_IntEntry(p,uVar2);
        if (iVar1 == -1) {
          uVar2 = Abc_ObjId(pAVar4);
          Vec_IntWriteEntry(p,uVar2,vMap._4_4_);
        }
        else {
          pAVar4 = Abc_NtkCo(pNtk,iVar1);
          pcVar6 = Abc_ObjName(pObj_00);
          iVar1 = Abc_ObjFaninC0(pAVar4);
          iVar3 = Abc_ObjFaninC0(pObj_00);
          pcVar7 = "!";
          if (iVar1 == iVar3) {
            pcVar7 = "";
          }
          pcVar8 = Abc_ObjName(pAVar4);
          printf("%s = %s%s\n",pcVar6,pcVar7,pcVar8);
        }
      }
    }
    else {
      pcVar6 = Abc_ObjName(pObj_00);
      iVar1 = Abc_ObjFaninC0(pObj_00);
      printf("%s = Const%d\n",pcVar6,(ulong)((iVar1 != 0 ^ 0xffU) & 1));
    }
  }
  Vec_IntFree(p);
  return;
}

Assistant:

void Abc_NtkPrintPoEquivs( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pDriver, * pRepr;  int i, iRepr;
    Vec_Int_t * vMap = Vec_IntStartFull( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        pDriver = Abc_ObjFanin0(pObj);
        if ( Abc_NtkIsStrash(pNtk) && pDriver == Abc_AigConst1(pNtk) )
        {
            printf( "%s = Const%d\n", Abc_ObjName(pObj), !Abc_ObjFaninC0(pObj) );
            continue;
        }
        else if ( !Abc_NtkIsStrash(pNtk) && Abc_NodeIsConst(pDriver) )
        {
            printf( "%s = Const%d\n", Abc_ObjName(pObj), Abc_NodeIsConst1(pDriver) );
            continue;
        }
        iRepr = Vec_IntEntry( vMap, Abc_ObjId(pDriver) );
        if ( iRepr == -1 )
        {
            Vec_IntWriteEntry( vMap, Abc_ObjId(pDriver), i );
            continue;
        }
        pRepr = Abc_NtkCo(pNtk, iRepr);
        printf( "%s = %s%s\n", Abc_ObjName(pObj), Abc_ObjFaninC0(pRepr) == Abc_ObjFaninC0(pObj) ? "" : "!", Abc_ObjName(pRepr) );
    }
    Vec_IntFree( vMap );
}